

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O2

JL_STATUS JlOutputJsonEx(JlDataObject *DataObject,JL_OUTPUT_FLAGS OutputFlags,
                        char **pJsonStringBuffer)

{
  JL_DATA_TYPE JVar1;
  JL_STATUS JVar2;
  JlBuffer *JsonBuffer;
  ProcessStack *Stack;
  size_t __n;
  void *__src;
  char *__dest;
  JlBuffer *flexiBuffer;
  
  if (pJsonStringBuffer == (char **)0x0 || DataObject == (JlDataObject *)0x0) {
    JVar2 = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    *pJsonStringBuffer = (char *)0x0;
    JsonBuffer = JlBufferCreate();
    if (JsonBuffer == (JlBuffer *)0x0) {
      JVar2 = JL_STATUS_OUT_OF_MEMORY;
    }
    else {
      flexiBuffer = JsonBuffer;
      Stack = (ProcessStack *)WjTestLib_Calloc(0x600,1);
      if (Stack == (ProcessStack *)0x0) {
        JVar2 = JL_STATUS_OUT_OF_MEMORY;
      }
      else {
        Stack[1].ObjectType = JL_DATA_TYPE_NONE;
        Stack[1].StartedEnumerating = false;
        Stack[1].ProcessedFirstItem = false;
        *(undefined2 *)&Stack[1].field_0xe = 0;
        Stack[1].field_4.ListEnumerator = (JlListItem *)0x0;
        Stack[1].Object = DataObject;
        JVar1 = JlGetObjectType(DataObject);
        Stack[1].ObjectType = JVar1;
        JVar2 = ProcessTheStack(Stack,JsonBuffer,OutputFlags);
        if (JVar2 == JL_STATUS_SUCCESS) {
          if ((OutputFlags & 2) != 0) {
            JlBufferAdd(JsonBuffer,"\n",1);
          }
          __n = JlBufferGetDataSize(JsonBuffer);
          __src = JlBufferGetDataBuffer(JsonBuffer);
          __dest = (char *)WjTestLib_Calloc(__n + 1,1);
          if (__dest == (char *)0x0) {
            JVar2 = JL_STATUS_OUT_OF_MEMORY;
          }
          else {
            memcpy(__dest,__src,__n);
            __dest[__n] = '\0';
            *pJsonStringBuffer = __dest;
            JVar2 = JL_STATUS_SUCCESS;
          }
        }
        WjTestLib_Free(Stack);
      }
      JlBufferFree(&flexiBuffer);
    }
  }
  return JVar2;
}

Assistant:

JL_STATUS
    JlOutputJsonEx
    (
        JlDataObject const*     DataObject,
        JL_OUTPUT_FLAGS         OutputFlags,
        char**                  pJsonStringBuffer
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DataObject
        &&  NULL != pJsonStringBuffer )
    {
        *pJsonStringBuffer = NULL;

        JlBuffer* flexiBuffer = JlBufferCreate( );
        if( NULL != flexiBuffer )
        {
            ProcessStack* stack = JlAlloc( sizeof(ProcessStack) * MAX_JSON_DEPTH );
            if( NULL != stack )
            {
                // Place object on stack in position 1. Note we do not use stack[0] to store anything as we
                // are using position 0 to indicate stack is empty
                memset( &stack[1], 0, sizeof(stack[1]) );
                stack[1].Object = DataObject;
                stack[1].ObjectType = JlGetObjectType( DataObject );

                jlStatus = ProcessTheStack( stack, flexiBuffer, OutputFlags );
                if( JL_STATUS_SUCCESS == jlStatus )
                {
                    if( JL_OUTPUT_FLAGS_INDENT & OutputFlags )
                    {
                        // If indented formatting is on then always end last line with a newline char
                        JlBufferAdd( flexiBuffer, "\n", 1 );
                    }

                    // Copy out the string in the flexibuffer into a newly allocated string.
                    size_t stringLen = JlBufferGetDataSize( flexiBuffer );
                    char const* dataBuffer =  JlBufferGetDataBuffer( flexiBuffer );
                    char* string = JlAlloc( stringLen + 1 );
                    if( NULL != string )
                    {
                        // Copy out string
                        memcpy( string, dataBuffer, stringLen );
                        string[stringLen] = 0;
                        *pJsonStringBuffer = string;
                    }
                    else
                    {
                        jlStatus = JL_STATUS_OUT_OF_MEMORY;
                    }
                }

                JlFree( stack );
            }
            else
            {
                jlStatus = JL_STATUS_OUT_OF_MEMORY;
            }

            JlBufferFree( &flexiBuffer );
        }
        else
        {
            jlStatus = JL_STATUS_OUT_OF_MEMORY;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}